

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Mutex.cpp
# Opt level: O1

bool __thiscall axl::sys::psx::MutexAttr::getType(MutexAttr *this,int *value)

{
  uint_t code;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  code = pthread_mutexattr_gettype((pthread_mutexattr_t *)this,value);
  if (code != 0) {
    err::Error::Error((Error *)&local_28,code);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    err::setError((ErrorRef *)&local_48);
    if (code != 0) {
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
    }
  }
  return code == 0;
}

Assistant:

bool
MutexAttr::getType(int* value) const {
	int result = ::pthread_mutexattr_gettype(&m_attr, value);
	return result == 0 ? true : err::fail(result);
}